

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O1

void __thiscall gl4cts::BufferStorage::Framebuffer::~Framebuffer(Framebuffer *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->m_id != 0xffffffff) {
    iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x440))(1,this);
    this->m_id = 0xffffffff;
  }
  return;
}

Assistant:

void Framebuffer::Release()
{
	if (m_invalid_id != m_id)
	{
		const Functions& gl = m_context.getRenderContext().getFunctions();

		gl.deleteFramebuffers(1, &m_id);
		m_id = m_invalid_id;
	}
}